

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O2

int response_determination(CManager cm,stone_type stone,action_class stage,event_item *event)

{
  action_value aVar1;
  EVstone EVar2;
  FMFormat *pp_Var3;
  _proto_action *p_Var4;
  CMConnection_conflict p_Var5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  FMStructDescList list;
  undefined8 *__ptr;
  long *plVar11;
  size_t sVar12;
  _event_path_data *p_Var13;
  extern_routines p_Var14;
  response_cache_element *prVar15;
  FMFormat p_Var16;
  cod_parse_context ppVar17;
  char *pcVar18;
  void *pvVar19;
  undefined8 uVar20;
  FMStructDescList *pp_Var21;
  FMFormat *pp_Var22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  void *local_78;
  FMFormat local_60;
  void *local_58;
  FMcompat_formats older_format;
  
  older_format = (FMcompat_formats)0x0;
  local_58 = INT_CMmalloc((long)stone->proto_action_count * 8 + 8);
  local_78 = INT_CMmalloc((long)stone->proto_action_count * 4 + 4);
  iVar24 = 0;
  for (lVar26 = 0; uVar8 = (ulong)stone->proto_action_count, lVar26 < (long)uVar8;
      lVar26 = lVar26 + 1) {
    iVar6 = proto_action_in_stage(stone->proto_actions + lVar26,stage);
    if (iVar6 != 0) {
      for (lVar23 = 0;
          (pp_Var3 = stone->proto_actions[lVar26].matching_reference_formats,
          pp_Var3 != (FMFormat *)0x0 && (*(long *)((long)pp_Var3 + lVar23) != 0));
          lVar23 = lVar23 + 8) {
        pcVar9 = (char *)name_of_FMformat(event->reference_format);
        pcVar10 = (char *)name_of_FMformat(*(undefined8 *)
                                            ((long)stone->proto_actions[lVar26].
                                                   matching_reference_formats + lVar23));
        iVar6 = strcmp(pcVar9,pcVar10);
        if (iVar6 == 0) {
          lVar25 = (long)iVar24;
          local_58 = INT_CMrealloc(local_58,lVar25 * 8 + 0x10);
          local_78 = INT_CMrealloc(local_78,lVar25 * 4 + 8);
          *(undefined8 *)((long)local_58 + lVar25 * 8) =
               *(undefined8 *)
                ((long)stone->proto_actions[lVar26].matching_reference_formats + lVar23);
          *(int *)((long)local_78 + lVar25 * 4) = (int)lVar26;
          iVar24 = iVar24 + 1;
        }
      }
    }
  }
  *(undefined8 *)((long)local_58 + (long)iVar24 * 8) = 0;
  if (event->reference_format == (FMFormat)0x0) {
    uVar28 = 0xffffffffffffffff;
    local_60 = (FMFormat)0x0;
    lVar26 = 0;
    for (uVar27 = 0; iVar24 = (int)uVar28, (long)uVar27 < (long)(int)uVar8; uVar27 = uVar27 + 1) {
      iVar24 = proto_action_in_stage
                         ((proto_action *)((long)&stone->proto_actions->action_type + lVar26),stage)
      ;
      if ((iVar24 != 0) &&
         ((plVar11 = *(long **)((long)&stone->proto_actions->matching_reference_formats + lVar26),
          plVar11 == (long *)0x0 || (*plVar11 == 0)))) {
        uVar28 = uVar27 & 0xffffffff;
      }
      uVar8 = (ulong)(uint)stone->proto_action_count;
      lVar26 = lVar26 + 0x60;
    }
LAB_00135154:
    if (iVar24 == -1) goto LAB_0013515f;
  }
  else {
    iVar6 = FMformat_compat_cmp2(event->reference_format,local_58,iVar24,&older_format);
    if (iVar6 != -1) {
      iVar24 = *(int *)((long)local_78 + (long)iVar6 * 4);
      local_60 = *(FMFormat *)((long)local_58 + (long)iVar6 * 8);
      goto LAB_00135154;
    }
    local_60 = (FMFormat)0x0;
LAB_0013515f:
    uVar8 = 0xffffffffffffffff;
    lVar26 = 0;
    for (uVar28 = 0; iVar24 = (int)uVar8, (long)uVar28 < (long)stone->proto_action_count;
        uVar28 = uVar28 + 1) {
      iVar24 = proto_action_in_stage
                         ((proto_action *)((long)&stone->proto_actions->action_type + lVar26),stage)
      ;
      if (iVar24 != 0) {
        p_Var4 = stone->proto_actions;
        plVar11 = *(long **)((long)&p_Var4->matching_reference_formats + lVar26);
        if (((plVar11 == (long *)0x0) || (*plVar11 == 0)) &&
           (uVar8 = uVar8 & 0xffffffff, *(int *)((long)&p_Var4->data_state + lVar26) != 1)) {
          uVar8 = uVar28 & 0xffffffff;
        }
        if ((*(int *)((long)&p_Var4->action_type + lVar26) == 6) &&
           (uVar8 = uVar8 & 0xffffffff, *(int *)(*(long *)((long)&p_Var4->o + lVar26) + 0x20) != 0))
        {
          uVar8 = uVar28 & 0xffffffff;
        }
      }
      lVar26 = lVar26 + 0x60;
    }
  }
  free(local_58);
  free(local_78);
  if (iVar24 == -1) {
    iVar24 = 0;
    goto LAB_00135b0d;
  }
  p_Var4 = stone->proto_actions;
  aVar1 = p_Var4[iVar24].action_type;
  if ((aVar1 == Action_Congestion) || (aVar1 == Action_Multi)) {
    pp_Var3 = p_Var4[iVar24].matching_reference_formats;
    p_Var5 = p_Var4[iVar24].o.bri.conn;
    __ptr = (undefined8 *)INT_CMmalloc(0x40);
    ppVar17 = (cod_parse_context)new_cod_parse_context();
    *__ptr = 0;
    __ptr[1] = 0;
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[4] = 0;
    __ptr[5] = 0;
    __ptr[6] = 0;
    __ptr[7] = 0;
    iVar6 = 0;
    for (pp_Var22 = pp_Var3; *pp_Var22 != (FMFormat)0x0; pp_Var22 = pp_Var22 + 1) {
      for (plVar11 = (long *)format_list_of_FMFormat(); *plVar11 != 0; plVar11 = plVar11 + 4) {
        cod_add_simple_struct_type(*plVar11,plVar11[1],ppVar17);
      }
      iVar6 = iVar6 + 1;
    }
    add_standard_routines(stone,ppVar17);
    add_metrics_routines(stone,ppVar17);
    add_queued_routines_externs._8_8_ = cod_ev_conforms;
    add_queued_routines_externs._24_8_ = cod_ev_discard_rel;
    add_queued_routines_externs._40_8_ = cod_ev_discard_rel;
    add_queued_routines_externs._56_8_ = cod_ev_discard_and_submit_rel;
    add_queued_routines_externs._72_8_ = cod_ev_discard_and_submit_rel;
    add_queued_routines_externs._88_8_ = cod_ev_get_data_rel;
    add_queued_routines_externs._104_8_ = cod_ev_get_data_rel;
    add_queued_routines_externs._120_8_ = cod_ev_count;
    add_queued_routines_externs._136_8_ = cod_ev_count;
    add_queued_routines_externs._152_8_ = cod_ev_present;
    add_queued_routines_externs._168_8_ = cod_ev_get_port;
    add_queued_routines_externs._184_8_ = cod_ev_target_size;
    add_queued_routines_externs._200_8_ = cod_ev_get_attrs;
    add_queued_routines_externs._216_8_ = cod_ev_get_attrs;
    cod_assoc_externs(ppVar17,add_queued_routines_externs);
    cod_parse_for_context(add_queued_routines_extern_string,ppVar17);
    cod_set_closure("EVdiscard_full",0xffffffffffffffff,ppVar17);
    cod_set_closure("EVdiscard_and_submit_full",0xffffffffffffffff,ppVar17);
    cod_set_closure("EVget_attrs_full",0xffffffffffffffff,ppVar17);
    cod_set_closure("EVdata_full",0xffffffffffffffff,ppVar17);
    cod_set_closure("EVcount_full",0xffffffffffffffff,ppVar17);
    for (lVar26 = 0; pp_Var3[lVar26] != (FMFormat)0x0; lVar26 = lVar26 + 1) {
      pcVar9 = (char *)name_of_FMformat();
      add_typed_queued_routines(ppVar17,(int)lVar26,pcVar9);
    }
    add_typed_queued_routines(ppVar17,-2,"anonymous");
    for (uVar8 = 0; pp_Var3[uVar8] != (FMFormat)0x0; uVar8 = uVar8 + 1) {
      pcVar9 = (char *)name_of_FMformat();
      sVar12 = strlen(pcVar9);
      pcVar10 = (char *)INT_CMmalloc(sVar12 + 4);
      sprintf(pcVar10,"%s_ID",pcVar9);
      cod_add_int_constant_to_parse_context(pcVar10,uVar8 & 0xffffffff,ppVar17);
      free(pcVar10);
    }
    p_Var13 = cm->evp;
    pp_Var21 = p_Var13->extern_structs;
    if (pp_Var21 != (FMStructDescList *)0x0) {
      lVar26 = 0;
      while (*(long *)((long)pp_Var21 + lVar26) != 0) {
        cod_add_struct_type(*(long *)((long)pp_Var21 + lVar26),ppVar17);
        p_Var13 = cm->evp;
        lVar26 = lVar26 + 8;
        pp_Var21 = p_Var13->extern_structs;
      }
    }
    p_Var14 = p_Var13->externs;
    if (p_Var14 != (extern_routines)0x0) {
      lVar26 = 0;
      while (*(long *)((long)&p_Var14->extern_decl + lVar26) != 0) {
        cod_assoc_externs(ppVar17,*(undefined8 *)((long)&p_Var14->externs + lVar26));
        cod_parse_for_context
                  (*(undefined8 *)((long)&cm->evp->externs->extern_decl + lVar26),ppVar17);
        lVar26 = lVar26 + 0x10;
        p_Var14 = cm->evp->externs;
      }
    }
    if (*(int *)&p_Var5->cm != 3) {
      __assert_fail("mrd->response_type == Response_Multityped",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                    ,0x92f,
                    "response_instance generate_multityped_code(CManager, struct response_spec *, stone_type, FMFormat *)"
                   );
    }
    cod_add_param("ec","cod_exec_context",0,ppVar17);
    cod_set_return_type("void",ppVar17);
    lVar26 = cod_code_gen(p_Var5->transport_data,ppVar17);
    *(undefined4 *)__ptr = *(undefined4 *)&p_Var5->cm;
    *(int *)(__ptr + 2) = iVar6;
    __ptr[6] = pp_Var3;
    __ptr[3] = lVar26;
    if (lVar26 != 0) {
      uVar20 = cod_create_exec_context(lVar26);
      __ptr[4] = uVar20;
    }
    cod_free_parse_context(ppVar17);
    if (__ptr[4] == 0) {
      free(__ptr);
      return 0;
    }
    EVar2 = stone->local_id;
    *(EVstone *)((long)__ptr + 4) = EVar2;
    *(int *)(__ptr + 1) = iVar24;
    INT_EVassoc_mutated_multi_action
              (cm,EVar2,iVar24,queued_wrapper,__ptr,p_Var4[iVar24].matching_reference_formats,
               free_multi_response);
    if ((*(int *)&p_Var5->io_out_buffer != 0) && (local_60 == (FMFormat)0x0)) {
      INT_EVassoc_anon_multi_action
                (cm,stone->local_id,iVar24,queued_wrapper,__ptr,event->reference_format);
    }
    iVar24 = 1;
    if (event->event_encoded == 0) goto LAB_00135b0d;
  }
  else if (aVar1 == Action_Immediate) {
    p_Var5 = p_Var4[iVar24].o.bri.conn;
    switch(*(undefined4 *)&p_Var5->cm) {
    case 0:
    case 2:
      local_60 = event->reference_format;
      if (event->event_encoded != 0) {
        list = (FMStructDescList)get_localized_formats();
        local_60 = EVregister_format_set(cm,list);
        free_struct_list(list);
      }
      break;
    case 1:
      local_60 = *(FMFormat *)&p_Var5->closed;
      break;
    case 3:
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                    ,0x523,
                    "int response_determination(CManager, stone_type, action_class, event_item *)");
    default:
      local_60 = (FMFormat)0x0;
    }
    pcVar9 = (char *)INT_CMmalloc(0x40);
    ppVar17 = (cod_parse_context)new_cod_parse_context();
    pcVar9[0] = '\0';
    pcVar9[1] = '\0';
    pcVar9[2] = '\0';
    pcVar9[3] = '\0';
    pcVar9[4] = '\0';
    pcVar9[5] = '\0';
    pcVar9[6] = '\0';
    pcVar9[7] = '\0';
    pcVar9[8] = '\0';
    pcVar9[9] = '\0';
    pcVar9[10] = '\0';
    pcVar9[0xb] = '\0';
    pcVar9[0xc] = '\0';
    pcVar9[0xd] = '\0';
    pcVar9[0xe] = '\0';
    pcVar9[0xf] = '\0';
    pcVar9[0x10] = '\0';
    pcVar9[0x11] = '\0';
    pcVar9[0x12] = '\0';
    pcVar9[0x13] = '\0';
    pcVar9[0x14] = '\0';
    pcVar9[0x15] = '\0';
    pcVar9[0x16] = '\0';
    pcVar9[0x17] = '\0';
    pcVar9[0x18] = '\0';
    pcVar9[0x19] = '\0';
    pcVar9[0x1a] = '\0';
    pcVar9[0x1b] = '\0';
    pcVar9[0x1c] = '\0';
    pcVar9[0x1d] = '\0';
    pcVar9[0x1e] = '\0';
    pcVar9[0x1f] = '\0';
    pcVar9[0x20] = '\0';
    pcVar9[0x21] = '\0';
    pcVar9[0x22] = '\0';
    pcVar9[0x23] = '\0';
    pcVar9[0x24] = '\0';
    pcVar9[0x25] = '\0';
    pcVar9[0x26] = '\0';
    pcVar9[0x27] = '\0';
    pcVar9[0x28] = '\0';
    pcVar9[0x29] = '\0';
    pcVar9[0x2a] = '\0';
    pcVar9[0x2b] = '\0';
    pcVar9[0x2c] = '\0';
    pcVar9[0x2d] = '\0';
    pcVar9[0x2e] = '\0';
    pcVar9[0x2f] = '\0';
    pcVar9[0x30] = '\0';
    pcVar9[0x31] = '\0';
    pcVar9[0x32] = '\0';
    pcVar9[0x33] = '\0';
    pcVar9[0x34] = '\0';
    pcVar9[0x35] = '\0';
    pcVar9[0x36] = '\0';
    pcVar9[0x37] = '\0';
    pcVar9[0x38] = '\0';
    pcVar9[0x39] = '\0';
    pcVar9[0x3a] = '\0';
    pcVar9[0x3b] = '\0';
    pcVar9[0x3c] = '\0';
    pcVar9[0x3d] = '\0';
    pcVar9[0x3e] = '\0';
    pcVar9[0x3f] = '\0';
    add_standard_routines(stone,ppVar17);
    add_metrics_routines(stone,ppVar17);
    p_Var13 = cm->evp;
    pp_Var21 = p_Var13->extern_structs;
    if (pp_Var21 != (FMStructDescList *)0x0) {
      lVar26 = 0;
      while (*(long *)((long)pp_Var21 + lVar26) != 0) {
        cod_add_struct_type(*(long *)((long)pp_Var21 + lVar26),ppVar17);
        p_Var13 = cm->evp;
        lVar26 = lVar26 + 8;
        pp_Var21 = p_Var13->extern_structs;
      }
    }
    p_Var14 = p_Var13->externs;
    if (p_Var14 != (extern_routines)0x0) {
      lVar26 = 0;
      while (*(long *)((long)&p_Var14->extern_decl + lVar26) != 0) {
        cod_assoc_externs(ppVar17,*(undefined8 *)((long)&p_Var14->externs + lVar26));
        cod_parse_for_context
                  (*(undefined8 *)((long)&cm->evp->externs->extern_decl + lVar26),ppVar17);
        lVar26 = lVar26 + 0x10;
        p_Var14 = cm->evp->externs;
      }
    }
    uVar7 = *(uint *)&p_Var5->cm;
    if (uVar7 < 3) {
      cod_add_param("ec","cod_exec_context",0,ppVar17);
      if (local_60 == (FMFormat)0x0) {
        cod_add_param("input","int",1,ppVar17);
      }
      else {
        add_param(ppVar17,"input",1,local_60);
      }
      if (*(int *)&p_Var5->cm == 1) {
        add_param(ppVar17,"output",2,(FMFormat)p_Var5->preloaded_formats);
        cod_add_param("event_attrs","attr_list",3,ppVar17);
        pcVar10 = "output_attrs";
        uVar20 = 4;
      }
      else {
        pcVar10 = "event_attrs";
        uVar20 = 2;
      }
      cod_add_param(pcVar10,"attr_list",uVar20,ppVar17);
      uVar7 = *(uint *)&p_Var5->cm;
    }
    else if (uVar7 == 3) {
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                    ,0x879,
                    "response_instance generate_filter_code(CManager, struct response_spec *, stone_type, FMFormat)"
                   );
    }
    if (uVar7 == 2) {
LAB_001358c7:
      pcVar10 = (char *)p_Var5->transport_data;
      iVar6 = dll_prefix_present(pcVar10);
      if (iVar6 == 0) {
        lVar26 = cod_code_gen(pcVar10,ppVar17);
        *(undefined4 *)pcVar9 = *(undefined4 *)&p_Var5->cm;
        *(long *)(pcVar9 + 0x18) = lVar26;
        if (lVar26 != 0) {
          uVar20 = cod_create_exec_context(lVar26);
          *(undefined8 *)(pcVar9 + 0x20) = uVar20;
        }
        pcVar9[0x10] = '\0';
        pcVar9[0x11] = '\0';
        pcVar9[0x12] = '\0';
        pcVar9[0x13] = '\0';
        pcVar9[0x14] = '\0';
        pcVar9[0x15] = '\0';
        pcVar9[0x16] = '\0';
        pcVar9[0x17] = '\0';
      }
      else {
        pcVar18 = extract_dll_path(pcVar10);
        pcVar10 = extract_symbol_name((char *)p_Var5->transport_data);
        if ((pcVar18 == (char *)0x0) || (pcVar10 == (char *)0x0)) {
          pvVar19 = p_Var5->transport_data;
LAB_00135b7e:
          fprintf(_stderr,"could not parse string \"%s\" for dll path and symbol information\n",
                  pvVar19);
          pcVar10 = pcVar9;
LAB_00135bcb:
          free(pcVar10);
          return 0;
        }
        pvVar19 = load_dll_symbol(cm,pcVar18,pcVar10);
        *(void **)(pcVar9 + 0x10) = pvVar19;
        if (pvVar19 == (void *)0x0) {
          fprintf(_stderr,"Failed to load symbol \"%s\" from file \"%s\"\n",pcVar10,pcVar18);
          free(pcVar9);
          free(pcVar18);
          goto LAB_00135bcb;
        }
        free(pcVar10);
        free(pcVar18);
        pcVar9[0x18] = '\0';
        pcVar9[0x19] = '\0';
        pcVar9[0x1a] = '\0';
        pcVar9[0x1b] = '\0';
        pcVar9[0x1c] = '\0';
        pcVar9[0x1d] = '\0';
        pcVar9[0x1e] = '\0';
        pcVar9[0x1f] = '\0';
      }
    }
    else if (uVar7 == 1) {
      pcVar10 = *(char **)&p_Var5->conn_ref_count;
      iVar6 = dll_prefix_present(pcVar10);
      if (iVar6 == 0) {
        lVar26 = cod_code_gen(pcVar10,ppVar17);
        pcVar9[0] = '\x01';
        pcVar9[1] = '\0';
        pcVar9[2] = '\0';
        pcVar9[3] = '\0';
        *(long *)(pcVar9 + 0x18) = lVar26;
        if (lVar26 != 0) {
          uVar20 = cod_create_exec_context(lVar26);
          *(undefined8 *)(pcVar9 + 0x20) = uVar20;
        }
      }
      else {
        pcVar18 = extract_dll_path(pcVar10);
        pcVar10 = extract_symbol_name(*(char **)&p_Var5->conn_ref_count);
        if ((pcVar18 == (char *)0x0) || (pcVar10 == (char *)0x0)) {
          pvVar19 = *(void **)&p_Var5->conn_ref_count;
          goto LAB_00135b7e;
        }
        pvVar19 = load_dll_symbol(cm,pcVar18,pcVar10);
        *(void **)(pcVar9 + 0x10) = pvVar19;
        if (pvVar19 == (void *)0x0) {
          fprintf(_stderr,"Failed to load symbol \"%s\" from file \"%s\"\n",pcVar10,pcVar18);
          free(pcVar9);
          free(pcVar18);
          goto LAB_00135bcb;
        }
        pcVar9[0x18] = '\0';
        pcVar9[0x19] = '\0';
        pcVar9[0x1a] = '\0';
        pcVar9[0x1b] = '\0';
        pcVar9[0x1c] = '\0';
        pcVar9[0x1d] = '\0';
        pcVar9[0x1e] = '\0';
        pcVar9[0x1f] = '\0';
        free(pcVar18);
        free(pcVar10);
      }
      *(int *)(pcVar9 + 0x28) = p_Var5->handshake_condition;
      *(FMFormat **)(pcVar9 + 0x38) = p_Var5->preloaded_formats;
    }
    else if (uVar7 == 0) goto LAB_001358c7;
    cod_free_parse_context(ppVar17);
    if (pcVar9 == (char *)0x0) {
      return 0;
    }
    EVar2 = stone->local_id;
    *(EVstone *)(pcVar9 + 4) = EVar2;
    *(int *)(pcVar9 + 8) = iVar24;
    iVar6 = *(int *)&p_Var5->cm;
    if (iVar6 == 2) {
      INT_EVassoc_mutated_imm_action
                (cm,EVar2,iVar24,router_wrapper,pcVar9,local_60,free_imm_response);
    }
    else if (iVar6 == 1) {
      INT_EVassoc_mutated_imm_action
                (cm,EVar2,iVar24,transform_wrapper,pcVar9,local_60,free_imm_response);
    }
    else {
      if (iVar6 != 0) {
        __assert_fail("FALSE",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                      ,0x53d,
                      "int response_determination(CManager, stone_type, action_class, event_item *)"
                     );
      }
      INT_EVassoc_mutated_imm_action
                (cm,EVar2,iVar24,filter_wrapper,pcVar9,local_60,free_imm_response);
    }
  }
  else {
    if (p_Var4[iVar24].matching_reference_formats == (FMFormat *)0x0) {
      local_60 = (FMFormat)0x0;
    }
    else {
      local_60 = *p_Var4[iVar24].matching_reference_formats;
    }
    if ((long)stone->response_cache_count == 0) {
      free(stone->response_cache);
      prVar15 = (response_cache_element *)INT_CMmalloc(0x30);
    }
    else {
      prVar15 = (response_cache_element *)
                INT_CMrealloc(stone->response_cache,(long)stone->response_cache_count * 0x30 + 0x30)
      ;
    }
    stone->response_cache = prVar15;
    iVar6 = stone->response_cache_count;
    stone->response_cache_count = iVar6 + 1;
    prVar15 = prVar15 + iVar6;
    p_Var4 = stone->proto_actions;
    p_Var16 = local_60;
    if (local_60 == (FMFormat)0x0) {
      p_Var16 = event->reference_format;
    }
    prVar15->reference_format = p_Var16;
    prVar15->proto_action_id = iVar24;
    prVar15->action_type = p_Var4[iVar24].action_type;
    prVar15->requires_decoded = (uint)(p_Var4[iVar24].data_state == Requires_Decoded);
    prVar15->stage = stage;
  }
  iVar24 = 1;
  if (local_60 != (FMFormat)0x0) {
    if (event->event_encoded == 0) {
      p_Var16 = event->reference_format;
      if (p_Var16 == local_60) goto LAB_00135b0d;
      iVar6 = stone->local_id;
    }
    else {
      iVar6 = stone->local_id;
      p_Var16 = event->reference_format;
    }
    INT_EVassoc_conversion_action(cm,iVar6,stage,local_60,p_Var16);
  }
LAB_00135b0d:
  fix_response_cache(stone);
  return iVar24;
}

Assistant:

int
response_determination(CManager cm, stone_type stone, action_class stage, event_item *event)
{
    int nearest_proto_action = -1;
    int return_value = 0;
    FMFormat conversion_target_format = NULL;
    FMFormat matching_format = NULL;
    int i, format_count = 0;
    FMFormat * formatList;
    int *format_map;
    FMcompat_formats older_format = NULL;

    formatList =
	(FMFormat *) malloc((stone->proto_action_count + 1) * sizeof(FMFormat));
    format_map = (int *) malloc((stone->proto_action_count + 1) * sizeof(int));
    for (i = 0; i < stone->proto_action_count; i++) {
	int j = 0;
        if (!proto_action_in_stage(&stone->proto_actions[i], stage)) {
            continue;
        }
	while (stone->proto_actions[i].matching_reference_formats &&
	       (stone->proto_actions[i].matching_reference_formats[j] != NULL)) {
	    if (strcmp(name_of_FMformat(event->reference_format), name_of_FMformat(stone->proto_actions[i].matching_reference_formats[j])) == 0 ) {
		formatList = (FMFormat *) realloc(formatList, (format_count + 2) * sizeof(FMFormat));
		format_map = realloc(format_map, (format_count + 2) * sizeof(int));
		formatList[format_count] = stone->proto_actions[i].matching_reference_formats[j];
		format_map[format_count] = i;
		format_count++;
	    }
	    j++;
	}
    }
    formatList[format_count] = NULL;
    if (event->reference_format == NULL) {
	/* special case for unformatted input */
	for (i=0 ; i < stone->proto_action_count ; i++) {
            if (!proto_action_in_stage(&stone->proto_actions[i], stage))
		continue;
	    if ((stone->proto_actions[i].matching_reference_formats == NULL) ||
		(stone->proto_actions[i].matching_reference_formats[0] == NULL))
		nearest_proto_action = i;
	}
    } else {
	int map_entry = FMformat_compat_cmp2(event->reference_format,
						    formatList,
						    format_count,
						    &older_format);
	if (map_entry != -1) {
            nearest_proto_action = format_map[map_entry];
            matching_format = formatList[map_entry];
        }
    }
    if (nearest_proto_action == -1) {
        /* special case for accepting anything */
        for (i=0; i < stone->proto_action_count; i++) {
            if (!proto_action_in_stage(&stone->proto_actions[i], stage)) continue;
            if (((stone->proto_actions[i].matching_reference_formats == NULL) ||
		 (stone->proto_actions[i].matching_reference_formats[0] == NULL))
                && stone->proto_actions[i].data_state != Requires_Decoded) {
                nearest_proto_action = i;
            }
            if (stone->proto_actions[i].action_type == Action_Multi) {
		struct response_spec *mrd;

		mrd =
		    stone->proto_actions[i].o.imm.mutable_response_data;
		if (mrd->u.multityped.accept_anonymous) {
		    nearest_proto_action = i;
		}
            }
        }
    }
    free(formatList);
    free(format_map);
    if (nearest_proto_action != -1) {
	int action_generated = 0;
	proto_action *proto = &stone->proto_actions[nearest_proto_action];
	if (proto->action_type == Action_Immediate) {
	    /* must be immediate action */
	    response_instance instance;
	    struct response_spec *mrd;
	    mrd =
		proto->o.imm.mutable_response_data;
	    switch(mrd->response_type) {
	    case Response_Filter:
	    case Response_Router:
		if (event->event_encoded) {
		    conversion_target_format =
			localize_format(cm, event->reference_format);
		} else {
		    conversion_target_format = event->reference_format;
		}
		break;
	    case Response_Transform:
		conversion_target_format = mrd->u.transform.reference_input_format;
		break;
	    case Response_Multityped:
		assert(FALSE);
                break;
	    }

	    instance = generate_filter_code(cm, mrd, stone, conversion_target_format);
	    if (instance == NULL) return 0;
	    instance->stone = stone->local_id;
	    instance->proto_action_id = nearest_proto_action;
	    action_generated++;
	    switch(mrd->response_type) {
	    case Response_Filter:
		INT_EVassoc_mutated_imm_action(cm, stone->local_id, nearest_proto_action,
					       filter_wrapper, instance,
					       conversion_target_format, free_imm_response);
		break;
	    case Response_Router:
		INT_EVassoc_mutated_imm_action(cm, stone->local_id, nearest_proto_action,
					       router_wrapper, instance,
					       conversion_target_format, free_imm_response);
		break;
	    case Response_Transform:
		INT_EVassoc_mutated_imm_action(cm, stone->local_id, nearest_proto_action,
					       transform_wrapper, instance,
					       conversion_target_format, free_imm_response);
		break;
            default:
		assert(FALSE);
		break;
	    }
	    return_value = 1;
	} else 	if (proto->action_type == Action_Multi || proto->action_type == Action_Congestion) {
	    response_instance instance;
	    struct response_spec *mrd;

	    mrd =
		proto->o.imm.mutable_response_data;
	    instance = generate_multityped_code(cm, mrd, stone,
						 proto->matching_reference_formats);
	    if (instance == 0) {
                return 0;
            }
	    instance->stone = stone->local_id;
	    instance->proto_action_id = nearest_proto_action;
	    action_generated++;
	    INT_EVassoc_mutated_multi_action(cm, stone->local_id, nearest_proto_action,
					     queued_wrapper, instance,
					     proto->matching_reference_formats, free_multi_response);
	    if (mrd->u.multityped.accept_anonymous && (matching_format == NULL)) {
		/* we're accepting this as an anonymous target */
		INT_EVassoc_anon_multi_action(cm, stone->local_id, nearest_proto_action, queued_wrapper, instance,
					      event->reference_format);
	    }
            if (event->event_encoded) {
                conversion_target_format = matching_format;
            }
            return_value = 1;
	} else {
	    response_cache_element *resp;

	    conversion_target_format = NULL;
	    if (proto->matching_reference_formats) {
		conversion_target_format = proto->matching_reference_formats[0];
	    }

	    /* we'll install the conversion later, first map the response */
	    if (stone->response_cache_count == 0) {
		if (stone->response_cache != NULL) free(stone->response_cache);
		stone->response_cache = malloc(sizeof(stone->response_cache[0]));
	    } else {
		stone->response_cache =
		    realloc(stone->response_cache,
			    (stone->response_cache_count + 1) * sizeof(stone->response_cache[0]));
	    }
	    resp = &stone->response_cache[stone->response_cache_count++];
	    proto_action *proto2 = &stone->proto_actions[nearest_proto_action];
	    if (conversion_target_format) {
		resp->reference_format = conversion_target_format;
	    } else {
		resp->reference_format = event->reference_format;
	    }
	    resp->proto_action_id = nearest_proto_action;
	    resp->action_type = proto2->action_type;
	    resp->requires_decoded = (proto2->data_state == Requires_Decoded);
            resp->stage = stage;
	}
	if (conversion_target_format != NULL) {
	    if (event->event_encoded) {
		/* create a decode action */
		INT_EVassoc_conversion_action(cm, stone->local_id, stage,
					      conversion_target_format,
					      event->reference_format);
		return_value = 1;
	    } else {
		if (event->reference_format != conversion_target_format) {
		    /* 
		     * create a decode action anyway, the event will be
		     * encoded to a buffer and then decoded into the target
		     * format.  Doing this more efficiently is difficult. 
		     */
		    INT_EVassoc_conversion_action(cm, stone->local_id, stage,
						  conversion_target_format,
						  event->reference_format);
		    return_value = 1;
		} else {
		    return_value = 1;
		}
	    }
	} else {
            return_value = 1;
        }
    }
    fix_response_cache(stone);
    return return_value;
}